

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O1

int SUNLinSolNumIters(SUNLinearSolver S)

{
  _func_int_SUNLinearSolver *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->numiters;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(S);
    return iVar1;
  }
  return 0;
}

Assistant:

int SUNLinSolNumIters(SUNLinearSolver S)
{
  int ier;
  if (S->ops->numiters)
    ier = S->ops->numiters(S);
  else
    ier = 0;
  return(ier);
}